

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O2

void __thiscall BamTools::Internal::BamToolsIndex::WriteHeader(BamToolsIndex *this)

{
  IBamIODevice *pIVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  BamException *this_00;
  allocator local_6e;
  allocator local_6d;
  int32_t numReferences;
  uint32_t blockSize;
  int32_t currentVersion;
  string local_60;
  string local_40;
  
  pIVar1 = (this->m_resources).Device;
  iVar2 = (*pIVar1->_vptr_IBamIODevice[8])(pIVar1,"BTI\x01",4);
  currentVersion = this->m_outputVersion;
  if (this->m_isBigEndian == true) {
    SwapEndian_32(&currentVersion);
  }
  pIVar1 = (this->m_resources).Device;
  iVar3 = (*pIVar1->_vptr_IBamIODevice[8])(pIVar1,&currentVersion,4);
  blockSize = this->m_blockSize;
  if (this->m_isBigEndian == true) {
    blockSize = blockSize >> 0x18 | (blockSize & 0xff0000) >> 8 | (blockSize & 0xff00) << 8 |
                blockSize << 0x18;
  }
  pIVar1 = (this->m_resources).Device;
  iVar4 = (*pIVar1->_vptr_IBamIODevice[8])(pIVar1,&blockSize,4);
  numReferences =
       (int32_t)((ulong)((long)(this->m_indexFileSummary).
                               super__Vector_base<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_indexFileSummary).
                              super__Vector_base<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 4);
  if (this->m_isBigEndian == true) {
    SwapEndian_32(&numReferences);
  }
  pIVar1 = (this->m_resources).Device;
  iVar5 = (*pIVar1->_vptr_IBamIODevice[8])(pIVar1,&numReferences,4);
  if (CONCAT44(extraout_var_00,iVar3) + CONCAT44(extraout_var,iVar2) +
      CONCAT44(extraout_var_01,iVar4) + CONCAT44(extraout_var_02,iVar5) == 0x10) {
    return;
  }
  this_00 = (BamException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_40,"BamToolsIndex::WriteHeader",&local_6d);
  std::__cxx11::string::string((string *)&local_60,"could not write BTI header",&local_6e);
  BamException::BamException(this_00,&local_40,&local_60);
  __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamToolsIndex::WriteHeader()
{

    int64_t numBytesWritten = 0;

    // write BTI index format 'magic number'
    numBytesWritten += m_resources.Device->Write(BamToolsIndex::BTI_MAGIC, 4);

    // write BTI index format version
    int32_t currentVersion = (int32_t)m_outputVersion;
    if (m_isBigEndian) SwapEndian_32(currentVersion);
    numBytesWritten +=
        m_resources.Device->Write((const char*)&currentVersion, sizeof(currentVersion));

    // write block size
    uint32_t blockSize = m_blockSize;
    if (m_isBigEndian) SwapEndian_32(blockSize);
    numBytesWritten += m_resources.Device->Write((const char*)&blockSize, sizeof(blockSize));

    // write number of references
    int32_t numReferences = m_indexFileSummary.size();
    if (m_isBigEndian) SwapEndian_32(numReferences);
    numBytesWritten +=
        m_resources.Device->Write((const char*)&numReferences, sizeof(numReferences));

    // check header written ok
    const int expectedBytes =
        4 + sizeof(currentVersion) + sizeof(blockSize) + sizeof(numReferences);
    if (numBytesWritten != expectedBytes)
        throw BamException("BamToolsIndex::WriteHeader", "could not write BTI header");
}